

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFindPackageCommand::SetModuleVariables
          (cmFindPackageCommand *this,string *components,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          *componentVarDefs)

{
  pointer ppVar1;
  size_t sVar2;
  char *pcVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *varDef;
  pointer var;
  string_view sVar4;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string quietly;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  string exact;
  cmAlphaNum local_98;
  string local_68;
  string components_var;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8._M_pod_data,"CMAKE_FIND_PACKAGE_NAME",(allocator<char> *)&local_98);
  sVar4._M_str = (this->Name)._M_dataplus._M_p;
  sVar4._M_len = (this->Name)._M_string_length;
  AddFindDefinition(this,(string *)&local_e8,sVar4);
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  std::operator+(&components_var,&this->Name,"_FIND_COMPONENTS");
  value._M_str = (components->_M_dataplus)._M_p;
  value._M_len = components->_M_string_length;
  AddFindDefinition(this,&components_var,value);
  ppVar1 = (componentVarDefs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (var = (componentVarDefs->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start; var != ppVar1; var = var + 1) {
    pcVar3 = var->second;
    sVar2 = strlen(pcVar3);
    value_00._M_str = pcVar3;
    value_00._M_len = sVar2;
    AddFindDefinition(this,&var->first,value_00);
  }
  if (this->Quiet != false) {
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0xd;
    local_98.View_._M_str = "_FIND_QUIETLY";
    cmStrCat<>(&quietly,(cmAlphaNum *)&local_e8,&local_98);
    value_01._M_str = "1";
    value_01._M_len = 1;
    AddFindDefinition(this,&quietly,value_01);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if (this->Required == true) {
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0xe;
    local_98.View_._M_str = "_FIND_REQUIRED";
    cmStrCat<>(&quietly,(cmAlphaNum *)&local_e8,&local_98);
    value_02._M_str = "1";
    value_02._M_len = 1;
    AddFindDefinition(this,&quietly,value_02);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if ((this->VersionComplete)._M_string_length != 0) {
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x16;
    local_98.View_._M_str = "_FIND_VERSION_COMPLETE";
    cmStrCat<>(&quietly,(cmAlphaNum *)&local_e8,&local_98);
    value_03._M_str = (this->VersionComplete)._M_dataplus._M_p;
    value_03._M_len = (this->VersionComplete)._M_string_length;
    AddFindDefinition(this,&quietly,value_03);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if ((this->Version)._M_string_length != 0) {
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0xd;
    local_98.View_._M_str = "_FIND_VERSION";
    cmStrCat<>(&quietly,(cmAlphaNum *)&local_e8,&local_98);
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:1243:24)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:1243:24)>
               ::_M_manager;
    local_e8._M_unused._M_object = this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&local_e8,&quietly,&this->Version,this->VersionCount,this->VersionMajor,
                        this->VersionMinor,this->VersionPatch,this->VersionTweak);
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x13;
    local_98.View_._M_str = "_FIND_VERSION_EXACT";
    cmStrCat<>(&exact,(cmAlphaNum *)&local_e8,&local_98);
    pcVar3 = "0";
    if (this->VersionExact != false) {
      pcVar3 = "1";
    }
    value_04._M_str = pcVar3;
    value_04._M_len = 1;
    AddFindDefinition(this,&exact,value_04);
    std::__cxx11::string::~string((string *)&exact);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if ((this->VersionRange)._M_string_length != 0) {
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x11;
    local_98.View_._M_str = "_FIND_VERSION_MIN";
    cmStrCat<>(&quietly,(cmAlphaNum *)&local_e8,&local_98);
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:1243:24)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:1243:24)>
               ::_M_manager;
    local_e8._M_unused._M_object = this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&local_e8,&quietly,&this->Version,this->VersionCount,this->VersionMajor,
                        this->VersionMinor,this->VersionPatch,this->VersionTweak);
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x11;
    local_98.View_._M_str = "_FIND_VERSION_MAX";
    cmStrCat<>(&exact,(cmAlphaNum *)&local_e8,&local_98);
    std::__cxx11::string::operator=((string *)&quietly,(string *)&exact);
    std::__cxx11::string::~string((string *)&exact);
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:1243:24)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:1243:24)>
               ::_M_manager;
    local_e8._M_unused._M_object = this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionMaxPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&local_e8,&quietly,&this->VersionMax,this->VersionMaxCount,
                        this->VersionMaxMajor,this->VersionMaxMinor,this->VersionMaxPatch,
                        this->VersionMaxTweak);
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x13;
    local_98.View_._M_str = "_FIND_VERSION_RANGE";
    cmStrCat<>(&exact,(cmAlphaNum *)&local_e8,&local_98);
    value_05._M_str = (this->VersionRange)._M_dataplus._M_p;
    value_05._M_len = (this->VersionRange)._M_string_length;
    AddFindDefinition(this,&exact,value_05);
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x17;
    local_98.View_._M_str = "_FIND_VERSION_RANGE_MIN";
    cmStrCat<>(&local_68,(cmAlphaNum *)&local_e8,&local_98);
    std::__cxx11::string::operator=((string *)&exact,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    AddFindDefinition(this,&exact,this->VersionRangeMin);
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x17;
    local_98.View_._M_str = "_FIND_VERSION_RANGE_MAX";
    cmStrCat<>(&local_68,(cmAlphaNum *)&local_e8,&local_98);
    std::__cxx11::string::operator=((string *)&exact,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    AddFindDefinition(this,&exact,this->VersionRangeMax);
    std::__cxx11::string::~string((string *)&exact);
    std::__cxx11::string::~string((string *)&quietly);
  }
  if (this->RegistryViewDefined == true) {
    local_e8._8_8_ = (this->Name)._M_dataplus._M_p;
    local_e8._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_98.View_._M_len = 0x13;
    local_98.View_._M_str = "_FIND_REGISTRY_VIEW";
    cmStrCat<>(&quietly,(cmAlphaNum *)&local_e8,&local_98);
    sVar4 = cmWindowsRegistry::FromView((this->super_cmFindCommon).RegistryView);
    AddFindDefinition(this,&quietly,sVar4);
    std::__cxx11::string::~string((string *)&quietly);
  }
  std::__cxx11::string::~string((string *)&components_var);
  return;
}

Assistant:

void cmFindPackageCommand::SetModuleVariables(
  const std::string& components,
  const std::vector<std::pair<std::string, const char*>>& componentVarDefs)
{
  this->AddFindDefinition("CMAKE_FIND_PACKAGE_NAME", this->Name);

  // Store the list of components and associated variable definitions
  std::string components_var = this->Name + "_FIND_COMPONENTS";
  this->AddFindDefinition(components_var, components);
  for (const auto& varDef : componentVarDefs) {
    this->AddFindDefinition(varDef.first, varDef.second);
  }

  if (this->Quiet) {
    // Tell the module that is about to be read that it should find
    // quietly.
    std::string quietly = cmStrCat(this->Name, "_FIND_QUIETLY");
    this->AddFindDefinition(quietly, "1"_s);
  }

  if (this->Required) {
    // Tell the module that is about to be read that it should report
    // a fatal error if the package is not found.
    std::string req = cmStrCat(this->Name, "_FIND_REQUIRED");
    this->AddFindDefinition(req, "1"_s);
  }

  if (!this->VersionComplete.empty()) {
    std::string req = cmStrCat(this->Name, "_FIND_VERSION_COMPLETE");
    this->AddFindDefinition(req, this->VersionComplete);
  }

  // Tell the module that is about to be read what version of the
  // package has been requested.
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->AddFindDefinition(variable, value);
  };

  if (!this->Version.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    // Tell the module whether an exact version has been requested.
    auto exact = cmStrCat(this->Name, "_FIND_VERSION_EXACT");
    this->AddFindDefinition(exact, this->VersionExact ? "1"_s : "0"_s);
  }
  if (!this->VersionRange.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION_MIN"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    prefix = cmStrCat(this->Name, "_FIND_VERSION_MAX"_s);
    this->SetVersionVariables(addDefinition, prefix, this->VersionMax,
                              this->VersionMaxCount, this->VersionMaxMajor,
                              this->VersionMaxMinor, this->VersionMaxPatch,
                              this->VersionMaxTweak);

    auto id = cmStrCat(this->Name, "_FIND_VERSION_RANGE");
    this->AddFindDefinition(id, this->VersionRange);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MIN");
    this->AddFindDefinition(id, this->VersionRangeMin);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MAX");
    this->AddFindDefinition(id, this->VersionRangeMax);
  }

  if (this->RegistryViewDefined) {
    this->AddFindDefinition(cmStrCat(this->Name, "_FIND_REGISTRY_VIEW"),
                            cmWindowsRegistry::FromView(this->RegistryView));
  }
}